

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O1

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
jsoncons::jsonpointer::
get<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
          (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
          basic_json_pointer<char> *location,bool create_if_missing,error_code *ec)

{
  pointer pbVar1;
  pointer pbVar2;
  string_view_type local_38;
  
  pbVar2 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 != pbVar1) {
    do {
      local_38._M_str = (pbVar2->_M_dataplus)._M_p;
      local_38._M_len = pbVar2->_M_string_length;
      root = detail::
             resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                       (root,&local_38,create_if_missing,ec);
      pbVar2 = pbVar2 + 1;
    } while (pbVar2 != pbVar1 && ec->_M_value == 0);
  }
  return root;
}

Assistant:

Json& get(Json& root, 
              const basic_json_pointer<typename Json::char_type>& location, 
              bool create_if_missing,
              std::error_code& ec)
    {
        if (location.empty())
        {
            return root;
        }

        Json* current = std::addressof(root);
        auto it = location.begin();
        auto end = location.end();
        while (it != end)
        {
            current = jsoncons::jsonpointer::detail::resolve(current, *it, create_if_missing, ec);
            if (JSONCONS_UNLIKELY(ec))
                return *current;
            ++it;
        }
        return *current;
    }